

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

uint __thiscall
wasm::UniqueDeferredQueue<unsigned_int>::pop(UniqueDeferredQueue<unsigned_int> *this)

{
  bool bVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  uint local_14;
  UniqueDeferredQueue<unsigned_int> *pUStack_10;
  uint item;
  UniqueDeferredQueue<unsigned_int> *this_local;
  
  pUStack_10 = this;
  do {
    bVar1 = empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,"T wasm::UniqueDeferredQueue<unsigned int>::pop() [T = unsigned int]");
    }
    pvVar2 = std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
             front(&this->data);
    local_14 = *pvVar2;
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::operator[](&this->count,&local_14);
    *pmVar3 = *pmVar3 - 1;
    std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
              (&this->data);
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::operator[](&this->count,&local_14);
  } while (*pmVar3 != 0);
  return local_14;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }